

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O3

bool __thiscall
OnDiskDataset::has_all_taints
          (OnDiskDataset *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  bool bVar5;
  
  p_Var2 = (taints->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(taints->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar4 = true;
  }
  else {
    do {
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->taints)._M_t,(key_type *)(p_Var2 + 1));
      bVar5 = (_Rb_tree_header *)cVar1._M_node == &(this->taints)._M_t._M_impl.super__Rb_tree_header
      ;
      bVar4 = !bVar5;
      if (bVar5) {
        return bVar4;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar4;
}

Assistant:

bool OnDiskDataset::has_all_taints(const std::set<std::string> &taints) const {
    for (const auto &taint : taints) {
        if (this->taints.count(taint) == 0) {
            return false;
        }
    }
    return true;
}